

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  int iVar1;
  size_t sVar2;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_ge point;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_ad8;
  secp256k1_scalar local_ac0;
  secp256k1_gej local_aa0;
  secp256k1_gej local_a08;
  secp256k1_ge local_970;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&local_a08);
  local_aa0.x.n[0] = (uint64_t)local_908;
  local_aa0.x.n[1] = (uint64_t)local_788;
  local_aa0.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_aa0,r,1,&local_a08,&secp256k1_scalar_zero,inp_g_sc);
  if (n_points != 0) {
    sVar2 = 0;
    do {
      iVar1 = (*cb)(&local_ac0,&local_970,sVar2,cbdata);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_gej_set_ge(&local_aa0,&local_970);
      local_ad8.aux = local_908;
      local_ad8.pre_a = local_788;
      local_ad8.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf
                (&local_ad8,&local_a08,1,&local_aa0,&local_ac0,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r,r,&local_a08,(secp256k1_fe *)0x0);
      sVar2 = sVar2 + 1;
    } while (n_points != sVar2);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}